

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::transform
          (Impl *this,Atom_t head,weight_t bound,WeightLitSpan *wlits,Strategy s)

{
  bool bVar1;
  long lVar2;
  Impl *this_00;
  Impl *this_01;
  iterator pWVar3;
  size_type ns;
  reference pWVar4;
  Atom_t *pAVar5;
  reference plVar6;
  int *x;
  size_type n;
  Span<Potassco::WeightLit_t> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_R8D;
  const_iterator end;
  const_iterator it;
  size_type i;
  wsum_t sum;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  WeightLit_t *in_stack_ffffffffffffff38;
  LitSpan *in_stack_ffffffffffffff40;
  Impl *b;
  Atom_t in_stack_ffffffffffffff4c;
  Impl *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff60;
  Atom_t h;
  WeightLit_t *local_58;
  size_type local_3c;
  Impl *local_30;
  uint32 local_4;
  
  *(undefined4 *)(in_RDI + 0x68) = in_EDX;
  lVar2 = in_RDI + 0x20;
  this_00 = (Impl *)Potassco::begin<Potassco::WeightLit_t>(in_RCX);
  Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x19df1c);
  bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
  assign<Potassco::WeightLit_t_const*>
            ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (WeightLit_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  this_01 = (Impl *)bk_lib::
                    pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::begin
                              ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                                *)(in_RDI + 0x20));
  pWVar3 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::end
                     ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                      (in_RDI + 0x20));
  bVar1 = isSorted<Potassco::WeightLit_t*,Clasp::Asp::RuleTransform::Impl::CmpW>(this_01,pWVar3);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff60 =
         bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::begin
                   ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                    (in_RDI + 0x20));
    pWVar3 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::end
                       ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20));
    std::stable_sort<Potassco::WeightLit_t*,Clasp::Asp::RuleTransform::Impl::CmpW>
              (in_stack_ffffffffffffff60,pWVar3);
  }
  local_30 = (Impl *)0x0;
  ns = (size_type)((ulong)(in_RDI + 0x30) >> 0x20);
  bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::size
            ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
             (in_RDI + 0x20));
  bk_lib::pod_vector<long,_std::allocator<long>_>::resize
            ((pod_vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60,ns,
             (long *)in_stack_ffffffffffffff50);
  local_3c = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::size
                       ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20));
  do {
    h = (Atom_t)((ulong)lVar2 >> 0x20);
    n = local_3c - 1;
    if (local_3c == 0) {
      if ((long)local_30 < (long)*(int *)(in_RDI + 0x68)) {
        local_4 = 0;
      }
      else if (*(int *)(in_RDI + 0x68) < 1) {
        Potassco::toSpan<int>();
        local_4 = addRule(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff40);
      }
      else {
        b = local_30;
        pWVar4 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
                 back((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                      (in_RDI + 0x20));
        if ((long)b - (long)pWVar4->weight < (long)*(int *)(in_RDI + 0x68)) {
          bk_lib::pod_vector<int,_std::allocator<int>_>::clear
                    ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
          local_58 = bk_lib::
                     pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
                     begin((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                            *)(in_RDI + 0x20));
          pWVar3 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                   ::end((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                          *)(in_RDI + 0x20));
          for (; local_58 != pWVar3; local_58 = local_58 + 1) {
            x = (int *)(in_RDI + 0x10);
            Potassco::lit(local_58);
            bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                      ((pod_vector<int,_std::allocator<int>_> *)b,x);
          }
          Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>
                    ((pod_vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_ESI,in_stack_ffffffffffffff30));
          local_4 = addRule(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(LitSpan *)b);
        }
        else if ((in_R8D == 1) || (((long)local_30 < 6 && (in_R8D == 0)))) {
          local_4 = transformSelect(this_00,h);
        }
        else {
          local_4 = transformSplit(this_01,(Atom_t)((ulong)in_RDI >> 0x20));
        }
      }
      return local_4;
    }
    pWVar4 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
             operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20),n);
    pAVar5 = (Atom_t *)std::min<int>(&pWVar4->weight,(int *)(in_RDI + 0x68));
    in_stack_ffffffffffffff4c = *pAVar5;
    pWVar4 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
             operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20),n);
    pWVar4->weight = in_stack_ffffffffffffff4c;
    pWVar4 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
             operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20),n);
    local_30 = (Impl *)((long)&((ebo *)&local_30->adapt_)->buf + (long)pWVar4->weight);
    in_stack_ffffffffffffff50 = local_30;
    plVar6 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                       ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x30),n);
    *plVar6 = (long)in_stack_ffffffffffffff50;
    pWVar4 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
             operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *
                        )(in_RDI + 0x20),n);
  } while ((-1 < pWVar4->weight) && (local_3c = n, (long)local_30 < 0x80000000));
  Potassco::fail(-2,
                 "uint32 Clasp::Asp::RuleTransform::Impl::transform(Atom_t, weight_t, const Potassco::WeightLitSpan &, Strategy)"
                 ,0xb7,"agg_[i].weight >= 0 && sum <= ( 2147483647)","invalid weight rule",0);
}

Assistant:

uint32 RuleTransform::Impl::transform(Atom_t head, weight_t bound, const Potassco::WeightLitSpan& wlits, Strategy s) {
	bound_ = bound;
	agg_.assign(begin(wlits), end(wlits));
	if (!isSorted(agg_.begin(), agg_.end(), CmpW())) {
		std::stable_sort(agg_.begin(), agg_.end(), CmpW());
	}
	wsum_t sum = 0;
	sumR_.resize(agg_.size());
	for (WLitVec::size_type i = agg_.size(); i--;) {
		agg_[i].weight = std::min(agg_[i].weight, bound_);
		sumR_[i] = (sum += agg_[i].weight);
		POTASSCO_REQUIRE(agg_[i].weight >= 0 && sum <= CLASP_WEIGHT_T_MAX, "invalid weight rule");
	}
	if      (bound_ > sum) { return 0; }
	else if (bound_ <= 0)  { return addRule(head, Potassco::toSpan<Potassco::Lit_t>()); }
	else if ((sum - agg_.back().weight) < bound_) { // normal rule
		lits_.clear();
		for (WLitVec::const_iterator it = agg_.begin(), end = agg_.end(); it != end; ++it) {
			lits_.push_back(lit(*it));
		}
		return addRule(head, Potassco::toSpan(lits_));
	}
	else {
		return ((s == strategy_no_aux || (sum < 6 && s == strategy_default))
			? transformSelect(head)
			: transformSplit(head));
	}
}